

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool mkvparser::Colour::Parse
               (IMkvReader *reader,longlong colour_start,longlong colour_size,Colour **colour)

{
  Colour *pCVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long stop;
  longlong read_pos;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  longlong child_size;
  longlong child_id;
  long local_50;
  Colour *local_48;
  longlong local_40;
  longlong local_38;
  
  if ((reader == (IMkvReader *)0x0) || (*colour != (Colour *)0x0)) {
    bVar4 = false;
  }
  else {
    local_48 = (Colour *)operator_new(0x70);
    local_48->matrix_coefficients = 0x7fffffffffffffff;
    local_48->bits_per_channel = 0x7fffffffffffffff;
    local_48->chroma_subsampling_horz = 0x7fffffffffffffff;
    local_48->chroma_subsampling_vert = 0x7fffffffffffffff;
    local_48->cb_subsampling_horz = 0x7fffffffffffffff;
    local_48->cb_subsampling_vert = 0x7fffffffffffffff;
    local_48->chroma_siting_horz = 0x7fffffffffffffff;
    local_48->chroma_siting_vert = 0x7fffffffffffffff;
    local_48->range = 0x7fffffffffffffff;
    local_48->transfer_characteristics = 0x7fffffffffffffff;
    local_48->primaries = 0x7fffffffffffffff;
    local_48->max_cll = 0x7fffffffffffffff;
    local_48->max_fall = 0x7fffffffffffffff;
    local_48->mastering_metadata = (MasteringMetadata *)0x0;
    stop = colour_size + colour_start;
    local_50 = colour_start;
    do {
      pCVar1 = local_48;
      bVar4 = stop <= local_50;
      if (stop <= local_50) {
        local_48 = (Colour *)0x0;
        *colour = pCVar1;
        break;
      }
      local_38 = 0;
      local_40 = 0;
      lVar3 = ParseElementHeader(reader,&local_50,stop,&local_38,&local_40);
      if (lVar3 < 0) break;
      switch(local_38) {
      case 0x55b1:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->matrix_coefficients = lVar3;
        break;
      case 0x55b2:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->bits_per_channel = lVar3;
        break;
      case 0x55b3:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->chroma_subsampling_horz = lVar3;
        break;
      case 0x55b4:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->chroma_subsampling_vert = lVar3;
        break;
      case 0x55b5:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->cb_subsampling_horz = lVar3;
        break;
      case 0x55b6:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->cb_subsampling_vert = lVar3;
        break;
      case 0x55b7:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->chroma_siting_horz = lVar3;
        break;
      case 0x55b8:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->chroma_siting_vert = lVar3;
        break;
      case 0x55b9:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->range = lVar3;
        break;
      case 0x55ba:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->transfer_characteristics = lVar3;
        break;
      case 0x55bb:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->primaries = lVar3;
        break;
      case 0x55bc:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->max_cll = lVar3;
        break;
      case 0x55bd:
        lVar3 = UnserializeUInt(reader,local_50,local_40);
        local_48->max_fall = lVar3;
        break;
      default:
        goto switchD_001141c9_caseD_55be;
      case 0x55d0:
        bVar2 = MasteringMetadata::Parse(reader,local_50,local_40,&local_48->mastering_metadata);
        if (bVar2) goto LAB_00114386;
        goto switchD_001141c9_caseD_55be;
      }
      if (lVar3 < 0) break;
LAB_00114386:
      local_50 = local_50 + local_40;
    } while (local_50 <= stop);
switchD_001141c9_caseD_55be:
    pCVar1 = local_48;
    if (local_48 != (Colour *)0x0) {
      ~Colour(local_48);
      operator_delete(pCVar1);
    }
  }
  return bVar4;
}

Assistant:

bool Colour::Parse(IMkvReader* reader, long long colour_start,
                   long long colour_size, Colour** colour) {
  if (!reader || *colour)
    return false;

  std::unique_ptr<Colour> colour_ptr(new Colour());
  if (!colour_ptr.get())
    return false;

  const long long colour_end = colour_start + colour_size;
  long long read_pos = colour_start;

  while (read_pos < colour_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long status =
        ParseElementHeader(reader, read_pos, colour_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvMatrixCoefficients) {
      colour_ptr->matrix_coefficients =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->matrix_coefficients < 0)
        return false;
    } else if (child_id == libwebm::kMkvBitsPerChannel) {
      colour_ptr->bits_per_channel =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->bits_per_channel < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingHorz) {
      colour_ptr->chroma_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingVert) {
      colour_ptr->chroma_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingHorz) {
      colour_ptr->cb_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingVert) {
      colour_ptr->cb_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingHorz) {
      colour_ptr->chroma_siting_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingVert) {
      colour_ptr->chroma_siting_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvRange) {
      colour_ptr->range = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->range < 0)
        return false;
    } else if (child_id == libwebm::kMkvTransferCharacteristics) {
      colour_ptr->transfer_characteristics =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->transfer_characteristics < 0)
        return false;
    } else if (child_id == libwebm::kMkvPrimaries) {
      colour_ptr->primaries = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->primaries < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxCLL) {
      colour_ptr->max_cll = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_cll < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxFALL) {
      colour_ptr->max_fall = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_fall < 0)
        return false;
    } else if (child_id == libwebm::kMkvMasteringMetadata) {
      if (!MasteringMetadata::Parse(reader, read_pos, child_size,
                                    &colour_ptr->mastering_metadata))
        return false;
    } else {
      return false;
    }

    read_pos += child_size;
    if (read_pos > colour_end)
      return false;
  }
  *colour = colour_ptr.release();
  return true;
}